

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::on_lsd_peer(session_impl *this,endpoint *peer,sha1_hash *ih)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bool bVar1;
  element_type *peVar2;
  torrent_info *ptVar3;
  info_hash_t *n;
  undefined8 uVar4;
  undefined1 local_f0 [48];
  string local_c0;
  bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void> local_9f;
  peer_source_flags_t local_9e;
  char local_9d;
  protocol_version v;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_8c;
  _func_int **local_88;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_80 [2];
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_78;
  info_hash_t local_74;
  undefined1 local_40 [16];
  undefined1 local_30 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  sha1_hash *ih_local;
  endpoint *peer_local;
  session_impl *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ih;
  counters::inc_stats_counter(&this->m_stats_counters,0x3d,1);
  local_88 = (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_vptr__Sp_counted_base;
  local_80[0].m_val =
       (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       )->_M_use_count;
  local_80[1].m_val =
       (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       )->_M_weak_count;
  local_78.m_val =
       *(uint *)&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi[1]._vptr__Sp_counted_base;
  info_hash_t::info_hash_t
            (&local_74,
             (array<unsigned_int,_5UL>)
             *(array<unsigned_int,_5UL> *)
              t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi);
  find_torrent((session_impl *)local_40,(info_hash_t *)this);
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_30);
  ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
            ((weak_ptr<libtorrent::aux::torrent> *)local_40);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    ptVar3 = torrent::torrent_file(peVar2);
    bVar1 = torrent_info::priv(ptVar3);
    if (!bVar1) {
      peVar2 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      ptVar3 = torrent::torrent_file(peVar2);
      bVar1 = torrent_info::is_i2p(ptVar3);
      if ((!bVar1) || (bVar1 = session_settings::get_bool(&this->m_settings,0x8017), bVar1)) {
        this_00._M_pi =
             t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
        peVar2 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        ptVar3 = torrent::torrent_file(peVar2);
        n = torrent_info::info_hashes(ptVar3);
        bVar1 = digest32<160L>::operator==((digest32<160L> *)this_00._M_pi,&n->v1);
        local_9d = !bVar1;
        peVar2 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        local_9e.m_val = '\b';
        if (local_9d == '\x01') {
          local_9f.m_val = 0x80;
        }
        else {
          libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>::
          bitfield_flag(&local_9f,'\0');
        }
        torrent::add_peer(peVar2,peer,local_9e,(pex_flags_t)local_9f.m_val);
        bVar1 = should_log(this);
        if (bVar1) {
          peVar2 = ::std::
                   __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_30);
          boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                    ((address *)(local_f0 + 0x10),peer);
          boost::asio::ip::address::to_string_abi_cxx11_(&local_c0,(address *)(local_f0 + 0x10));
          uVar4 = ::std::__cxx11::string::c_str();
          (*(peVar2->super_request_callback)._vptr_request_callback[7])
                    (peVar2,"lsd add_peer() [ %s ]",uVar4);
          ::std::__cxx11::string::~string((string *)&local_c0);
        }
        peVar2 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        torrent::do_connect_boost(peVar2);
        bVar1 = alert_manager::should_post<libtorrent::lsd_peer_alert>(&this->m_alerts);
        if (bVar1) {
          ::std::
          __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_30);
          torrent::get_handle((torrent *)local_f0);
          alert_manager::
          emplace_alert<libtorrent::lsd_peer_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&>
                    (&this->m_alerts,(torrent_handle *)local_f0,peer);
          torrent_handle::~torrent_handle((torrent_handle *)local_f0);
        }
        local_8c.m_val = 0;
        goto LAB_0059c8fb;
      }
    }
    local_8c.m_val = 1;
  }
  else {
    local_8c.m_val = 1;
  }
LAB_0059c8fb:
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_30);
  return;
}

Assistant:

void session_impl::on_lsd_peer(tcp::endpoint const& peer, sha1_hash const& ih)
	{
		m_stats_counters.inc_stats_counter(counters::on_lsd_peer_counter);
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		std::shared_ptr<torrent> t = find_torrent(info_hash_t(ih)).lock();
		if (!t) return;
		// don't add peers from lsd to private torrents
		if (t->torrent_file().priv() || (t->torrent_file().is_i2p()
			&& !m_settings.get_bool(settings_pack::allow_i2p_mixed))) return;

		protocol_version const v = ih == t->torrent_file().info_hashes().v1
			? protocol_version::V1 : protocol_version::V2;

		t->add_peer(peer, peer_info::lsd, v == protocol_version::V2 ? pex_lt_v2 : pex_flags_t(0));
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			t->debug_log("lsd add_peer() [ %s ]"
				, peer.address().to_string().c_str());
		}
#endif
		t->do_connect_boost();

		if (m_alerts.should_post<lsd_peer_alert>())
			m_alerts.emplace_alert<lsd_peer_alert>(t->get_handle(), peer);
	}